

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestRebuildOrderOnlyDeps::Run(BuildTestRebuildOrderOnlyDeps *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Builder *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  int *piVar1;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  Node *pNVar6;
  string err;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_58;
  VirtualFileSystem *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_BuildTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule cc\n  command = cc $in\nrule true\n  command = true\nbuild oo.h: cc oo.h.in\nbuild foo.o: cc foo.c || oo.h\n"
              ,(ManifestParserOptions)0x0);
  iVar5 = g_current_test->assertion_failures_;
  if (iVar2 == iVar5) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"foo.c",&local_99);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_9a);
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Create(this_00,&local_98,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"oo.h.in",&local_99);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_9a);
    local_38 = this_00;
    VirtualFileSystem::Create(this_00,&local_98,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"foo.o",(allocator<char> *)&local_78);
    this_01 = &(this->super_BuildTest).builder_;
    pNVar6 = Builder::AddTarget(this_01,&local_98,&local_58);
    testing::Test::Check
              (pTVar3,pNVar6 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x441,"builder_.AddTarget(\"foo.o\", &err)");
    std::__cxx11::string::~string((string *)&local_98);
    pTVar3 = g_current_test;
    bVar4 = Builder::Build(this_01,&local_58);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x442,"builder_.Build(&err)");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_58);
    bVar4 = testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x443,"\"\" == err");
    if ((bVar4) &&
       (bVar4 = testing::Test::Check
                          (g_current_test,
                           (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x40,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x444,"2u == command_runner_.commands_ran_.size()"), bVar4)) {
      this_02 = &(this->super_BuildTest).command_runner_.commands_ran_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_02);
      State::Reset(state);
      pTVar3 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"foo.o",(allocator<char> *)&local_78);
      pNVar6 = Builder::AddTarget(this_01,&local_98,&local_58);
      testing::Test::Check
                (pTVar3,pNVar6 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x449,"builder_.AddTarget(\"foo.o\", &err)");
      std::__cxx11::string::~string((string *)&local_98);
      pTVar3 = g_current_test;
      bVar4 = std::operator==("",&local_58);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x44a,"\"\" == err");
      pTVar3 = g_current_test;
      bVar4 = Builder::AlreadyUpToDate(this_01);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,1099,"builder_.AlreadyUpToDate()");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"oo.h",(allocator<char> *)&local_78);
      VirtualFileSystem::RemoveFile(local_38,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_02);
      State::Reset(state);
      pTVar3 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"foo.o",(allocator<char> *)&local_78);
      pNVar6 = Builder::AddTarget(this_01,&local_98,&local_58);
      testing::Test::Check
                (pTVar3,pNVar6 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x451,"builder_.AddTarget(\"foo.o\", &err)");
      std::__cxx11::string::~string((string *)&local_98);
      pTVar3 = g_current_test;
      bVar4 = Builder::Build(this_01,&local_58);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x452,"builder_.Build(&err)");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("",&local_58);
      bVar4 = testing::Test::Check
                        (pTVar3,bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x453,"\"\" == err");
      if ((bVar4) &&
         (bVar4 = testing::Test::Check
                            (g_current_test,
                             (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start == 0x20,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x454,"1u == command_runner_.commands_ran_.size()"),
         pTVar3 = g_current_test, bVar4)) {
        bVar4 = std::operator==("cc oo.h.in",
                                (this_02->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
        bVar4 = testing::Test::Check
                          (pTVar3,bVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x455,"\"cc oo.h.in\" == command_runner_.commands_ran_[0]");
        if (bVar4) {
          piVar1 = &(this->super_BuildTest).fs_.now_;
          *piVar1 = *piVar1 + 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"oo.h.in",&local_99);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_9a);
          VirtualFileSystem::Create(local_38,&local_98,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(this_02);
          State::Reset(state);
          pTVar3 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"foo.o",(allocator<char> *)&local_78);
          pNVar6 = Builder::AddTarget(this_01,&local_98,&local_58);
          testing::Test::Check
                    (pTVar3,pNVar6 != (Node *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x45d,"builder_.AddTarget(\"foo.o\", &err)");
          std::__cxx11::string::~string((string *)&local_98);
          pTVar3 = g_current_test;
          bVar4 = Builder::Build(this_01,&local_58);
          testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x45e,"builder_.Build(&err)");
          pTVar3 = g_current_test;
          bVar4 = std::operator==("",&local_58);
          bVar4 = testing::Test::Check
                            (pTVar3,bVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x45f,"\"\" == err");
          if ((bVar4) &&
             (bVar4 = testing::Test::Check
                                (g_current_test,
                                 (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start == 0x20,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                 ,0x460,"1u == command_runner_.commands_ran_.size()"),
             pTVar3 = g_current_test, bVar4)) {
            bVar4 = std::operator==("cc oo.h.in",
                                    (this_02->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
            bVar4 = testing::Test::Check
                              (pTVar3,bVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0x461,"\"cc oo.h.in\" == command_runner_.commands_ran_[0]");
            if (bVar4) goto LAB_0012a4e3;
          }
        }
      }
    }
    iVar5 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar5 + 1;
LAB_0012a4e3:
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

TEST_F(BuildTest, RebuildOrderOnlyDeps) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n  command = cc $in\n"
"rule true\n  command = true\n"
"build oo.h: cc oo.h.in\n"
"build foo.o: cc foo.c || oo.h\n"));

  fs_.Create("foo.c", "");
  fs_.Create("oo.h.in", "");

  // foo.o and order-only dep dirty, build both.
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, command_runner_.commands_ran_.size());

  // all clean, no rebuild.
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());

  // order-only dep missing, build it only.
  fs_.RemoveFile("oo.h");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  ASSERT_EQ("cc oo.h.in", command_runner_.commands_ran_[0]);

  fs_.Tick();

  // order-only dep dirty, build it only.
  fs_.Create("oo.h.in", "");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  ASSERT_EQ("cc oo.h.in", command_runner_.commands_ran_[0]);
}